

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O2

void __thiscall irr::scene::CMeshSceneNode::copyMaterials(CMeshSceneNode *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  SMaterial *pSVar4;
  u32 i;
  uint uVar5;
  SMaterial mat;
  SMaterial SStack_d8;
  undefined8 *puVar3;
  
  core::array<irr::video::SMaterial>::clear(&this->Materials);
  if (this->Mesh != (IMesh *)0x0) {
    video::SMaterial::SMaterial(&SStack_d8);
    uVar5 = 0;
    while( true ) {
      uVar1 = (**this->Mesh->_vptr_IMesh)();
      if (uVar1 <= uVar5) break;
      iVar2 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,(ulong)uVar5);
      puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
      if (puVar3 != (undefined8 *)0x0) {
        pSVar4 = (SMaterial *)(**(code **)*puVar3)(puVar3);
        video::SMaterial::operator=(&SStack_d8,pSVar4);
      }
      core::array<irr::video::SMaterial>::push_back(&this->Materials,&SStack_d8);
      uVar5 = uVar5 + 1;
    }
    video::SMaterial::~SMaterial(&SStack_d8);
  }
  return;
}

Assistant:

void CMeshSceneNode::copyMaterials()
{
	Materials.clear();

	if (Mesh) {
		video::SMaterial mat;

		for (u32 i = 0; i < Mesh->getMeshBufferCount(); ++i) {
			IMeshBuffer *mb = Mesh->getMeshBuffer(i);
			if (mb)
				mat = mb->getMaterial();

			Materials.push_back(mat);
		}
	}
}